

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O2

void __thiscall osc::ReceivedMessageArgumentIterator::Advance(ReceivedMessageArgumentIterator *this)

{
  char **ppcVar1;
  char *pcVar2;
  char cVar3;
  uint32 uVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar5 = (this->value_).typeTagPtr_;
  if (pcVar5 != (char *)0x0) {
    (this->value_).typeTagPtr_ = pcVar5 + 1;
    cVar3 = *pcVar5;
    switch(cVar3) {
    case 'S':
    case 's':
      pcVar5 = (this->value_).argumentPtr_;
      if (*pcVar5 == '\0') {
        pcVar6 = pcVar5 + 4;
      }
      else {
        do {
          pcVar6 = pcVar5 + 4;
          pcVar2 = pcVar5 + 3;
          pcVar5 = pcVar6;
        } while (*pcVar2 != '\0');
      }
      (this->value_).argumentPtr_ = pcVar6;
      break;
    case 'T':
    case '[':
    case ']':
      break;
    case 'b':
      pcVar5 = (this->value_).argumentPtr_;
      uVar4 = ToUInt32(pcVar5);
      (this->value_).argumentPtr_ = pcVar5 + (ulong)(uVar4 + 3 & 0xfffffffc) + 4;
      break;
    case 'c':
    case 'f':
    case 'i':
    case 'm':
    case 'r':
      ppcVar1 = &(this->value_).argumentPtr_;
      *ppcVar1 = *ppcVar1 + 4;
      break;
    case 'd':
    case 'h':
    case 't':
      ppcVar1 = &(this->value_).argumentPtr_;
      *ppcVar1 = *ppcVar1 + 8;
      break;
    default:
      if (cVar3 == 'N') {
        return;
      }
      if (cVar3 == 'F') {
        return;
      }
      if (cVar3 == 'I') {
        return;
      }
    case 'U':
    case 'V':
    case 'W':
    case 'X':
    case 'Y':
    case 'Z':
    case '\\':
    case '^':
    case '_':
    case '`':
    case 'a':
    case 'e':
    case 'g':
    case 'j':
    case 'k':
    case 'l':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
      (this->value_).typeTagPtr_ = pcVar5;
    }
  }
  return;
}

Assistant:

void ReceivedMessageArgumentIterator::Advance()
{
    if( !value_.typeTagPtr_ )
        return;
        
    switch( *value_.typeTagPtr_++ ){
        case '\0':
            // don't advance past end
            --value_.typeTagPtr_;
            break;
            
        case TRUE_TYPE_TAG:
        case FALSE_TYPE_TAG:
        case NIL_TYPE_TAG:
        case INFINITUM_TYPE_TAG:
        
            // zero length
            break;

        case INT32_TYPE_TAG:
        case FLOAT_TYPE_TAG: 					
        case CHAR_TYPE_TAG:
        case RGBA_COLOR_TYPE_TAG:
        case MIDI_MESSAGE_TYPE_TAG:

            value_.argumentPtr_ += 4;
            break;

        case INT64_TYPE_TAG:
        case TIME_TAG_TYPE_TAG:
        case DOUBLE_TYPE_TAG:
				
            value_.argumentPtr_ += 8;
            break;

        case STRING_TYPE_TAG: 
        case SYMBOL_TYPE_TAG:

            // we use the unsafe function FindStr4End(char*) here because all of
            // the arguments have already been validated in
            // ReceivedMessage::Init() below.
            
            value_.argumentPtr_ = FindStr4End( value_.argumentPtr_ );
            break;

        case BLOB_TYPE_TAG:
            {
                // treat blob size as an unsigned int for the purposes of this calculation
                uint32 blobSize = ToUInt32( value_.argumentPtr_ );
                value_.argumentPtr_ = value_.argumentPtr_ + osc::OSC_SIZEOF_INT32 + RoundUp4( blobSize );
            }
            break;

        case ARRAY_BEGIN_TYPE_TAG:
        case ARRAY_END_TYPE_TAG: 

            //    [ Indicates the beginning of an array. The tags following are for
            //        data in the Array until a close brace tag is reached.
            //    ] Indicates the end of an array.

            // zero length, don't advance argument ptr
            break;

        default:    // unknown type tag
            // don't advance
            --value_.typeTagPtr_;
            break;
    }
}